

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O3

int m2v_LU_det(m2v *LU)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  
  if (0 < LU->n_col) {
    iVar1 = 1;
    uVar2 = 0;
    lVar3 = 0;
    do {
      if ((LU->e[(uVar2 >> 5) + lVar3] >> ((uint)uVar2 & 0x1f) & 1) == 0) {
        iVar1 = 0;
      }
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + LU->row_stride;
    } while (LU->n_col != (int)uVar2);
    return iVar1;
  }
  return 1;
}

Assistant:

MV_GEN_ELTYPE MV_GEN_N(_LU_det)(const MV_GEN_TYPE* LU)
{
	assert(LU->n_row == LU->n_col);

	MV_GEN_ELTYPE det = 1;
	for (int i = 0; i < LU->n_col; ++i) {
		det = fmul(det, MV_GEN_N(_get_el)(LU, i, i));
	}

	return det;
}